

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# greg.c
# Opt level: O0

int yy_trailer(GREG *G)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int yythunkpos103;
  int yypos103;
  int yythunkpos0;
  int yypos0;
  GREG *G_local;
  
  iVar1 = G->pos;
  iVar2 = G->thunkpos;
  iVar3 = yymatchString(G,"%%");
  if (iVar3 == 0) {
    G->pos = iVar1;
    G->thunkpos = iVar2;
    G_local._4_4_ = 0;
  }
  else {
    yyText(G,G->begin,G->end);
    G->begin = G->pos;
    do {
      iVar1 = G->pos;
      iVar2 = G->thunkpos;
      iVar3 = yymatchDot(G);
    } while (iVar3 != 0);
    G->pos = iVar1;
    G->thunkpos = iVar2;
    yyText(G,G->begin,G->end);
    G->end = G->pos;
    yyDo(G,yy_1_trailer,G->begin,G->end,"yy_1_trailer");
    G_local._4_4_ = 1;
  }
  return G_local._4_4_;
}

Assistant:

YY_RULE(int) yy_trailer(GREG *G)
{  int yypos0= G->pos, yythunkpos0= G->thunkpos;  yyprintfv((stderr, "%s\n", "trailer"));
  if (!yymatchString(G, "%%")) goto l101;
  yyText(G, G->begin, G->end);  if (!(YY_BEGIN)) goto l101;
  l102:;	
  {  int yypos103= G->pos, yythunkpos103= G->thunkpos;  if (!yymatchDot(G)) goto l103;  goto l102;
  l103:;	  G->pos= yypos103; G->thunkpos= yythunkpos103;
  }  yyText(G, G->begin, G->end);  if (!(YY_END)) goto l101;  yyDo(G, yy_1_trailer, G->begin, G->end, "yy_1_trailer");
  yyprintf((stderr, "  ok   trailer"));
  yyprintfGcontext;
  yyprintf((stderr, "\n"));

  return 1;
  l101:;	  G->pos= yypos0; G->thunkpos= yythunkpos0;  yyprintfv((stderr, "  fail %s", "trailer"));
  yyprintfvGcontext;
  yyprintfv((stderr, "\n"));

  return 0;
}